

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

void Ivy_FraigSavePattern3(Ivy_FraigMan_t *p)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  uint *puVar3;
  sat_solver *psVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  
  if (0 < p->nPatWords) {
    lVar10 = 0;
    do {
      iVar5 = rand();
      iVar6 = rand();
      uVar7 = rand();
      p->pPatWords[lVar10] = uVar7 ^ iVar6 << 0xc ^ iVar5 << 0x18;
      lVar10 = lVar10 + 1;
    } while (lVar10 < p->nPatWords);
  }
  pVVar1 = p->vPiVars;
  iVar5 = pVVar1->nSize;
  if (0 < iVar5) {
    ppvVar2 = pVVar1->pArray;
    puVar3 = p->pPatWords;
    psVar4 = p->pSat;
    lVar10 = 0;
    do {
      uVar8 = *ppvVar2[lVar10] - 1;
      iVar6 = (int)uVar8 >> 5;
      uVar7 = puVar3[iVar6];
      uVar8 = uVar8 & 0x1f;
      uVar9 = (uint)*(undefined8 *)((long)ppvVar2[lVar10] + 0x28);
      if (((int)uVar9 < 0) || (psVar4->size <= (int)uVar9)) {
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0xda,"int sat_solver_var_value(sat_solver *, int)");
      }
      if (((psVar4->model[uVar9 & 0x7fffffff] != 1 ^ (byte)(uVar7 >> (sbyte)uVar8)) & 1) == 0) {
        puVar3[iVar6] = uVar7 ^ 1 << uVar8;
        iVar5 = pVVar1->nSize;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar5);
  }
  return;
}

Assistant:

void Ivy_FraigSavePattern3( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    for ( i = 0; i < p->nPatWords; i++ )
        p->pPatWords[i] = Ivy_ObjRandomSim();
    Vec_PtrForEachEntry( Ivy_Obj_t *, p->vPiVars, pObj, i )
//        if ( Ivy_InfoHasBit( p->pPatWords, pObj->Id - 1 ) ^ (p->pSat->model.ptr[Ivy_ObjSatNum(pObj)] == l_True) )
        if ( Ivy_InfoHasBit( p->pPatWords, pObj->Id - 1 ) ^ sat_solver_var_value(p->pSat, Ivy_ObjSatNum(pObj)) )
            Ivy_InfoXorBit( p->pPatWords, pObj->Id - 1 );
}